

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void spo_room(sp_coder *coder,level *lev)

{
  opvar *ov;
  opvar *ov_00;
  opvar *ov_01;
  opvar *ov_02;
  opvar *ov_03;
  opvar *ov_04;
  opvar *ov_05;
  opvar *ov_06;
  opvar *ov_07;
  mkroom *pmVar1;
  mkroom *tmpcr;
  room tmproom;
  opvar *rtype;
  opvar *chance;
  opvar *rlit;
  opvar *x;
  opvar *y;
  opvar *xalign;
  opvar *yalign;
  opvar *w;
  opvar *h;
  opvar *filled;
  level *lev_local;
  sp_coder *coder_local;
  
  if (coder->n_subroom < 6) {
    ov = splev_stack_getdat(coder,'\x01');
    if ((((((ov != (opvar *)0x0) &&
           (ov_00 = splev_stack_getdat(coder,'\x01'), ov_00 != (opvar *)0x0)) &&
          (ov_01 = splev_stack_getdat(coder,'\x01'), ov_01 != (opvar *)0x0)) &&
         ((ov_02 = splev_stack_getdat(coder,'\x01'), ov_02 != (opvar *)0x0 &&
          (ov_03 = splev_stack_getdat(coder,'\x01'), ov_03 != (opvar *)0x0)))) &&
        ((ov_04 = splev_stack_getdat(coder,'\x01'), ov_04 != (opvar *)0x0 &&
         ((ov_05 = splev_stack_getdat(coder,'\x01'), ov_05 != (opvar *)0x0 &&
          (ov_06 = splev_stack_getdat(coder,'\x01'), ov_06 != (opvar *)0x0)))))) &&
       ((ov_07 = splev_stack_getdat(coder,'\x01'), ov_07 != (opvar *)0x0 &&
        (tmproom._24_8_ = splev_stack_getdat(coder,'\x01'), (opvar *)tmproom._24_8_ != (opvar *)0x0)
        ))) {
      tmproom.parent.len._0_1_ = SUB81(ov_02->vardata,0);
      tmproom.parent.len._1_1_ = SUB81(ov_01->vardata,0);
      tmproom.parent.len._2_1_ = SUB81(ov_00->vardata,0);
      tmproom.parent.len._3_1_ = SUB81(ov->vardata,0);
      tmproom.parent._4_1_ = SUB81(ov_04->vardata,0);
      tmproom.parent._5_1_ = SUB81(ov_03->vardata,0);
      tmproom.parent._6_1_ = SUB81(((opvar *)tmproom._24_8_)->vardata,0);
      tmproom.parent._7_1_ = SUB81(ov_07->vardata,0);
      tmproom.x = (xchar)(ov_06->vardata).l;
      tmproom.y = (xchar)(ov_05->vardata).l;
      if (ov_02 == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_room");
      }
      else {
        opvar_free_x(ov_02);
      }
      if (ov_01 == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_room");
      }
      else {
        opvar_free_x(ov_01);
      }
      if (ov_00 == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_room");
      }
      else {
        opvar_free_x(ov_00);
      }
      if (ov == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_room");
      }
      else {
        opvar_free_x(ov);
      }
      if (ov_04 == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_room");
      }
      else {
        opvar_free_x(ov_04);
      }
      if (ov_03 == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_room");
      }
      else {
        opvar_free_x(ov_03);
      }
      if (tmproom._24_8_ == 0) {
        impossible("opvar_free(), %s","spo_room");
      }
      else {
        opvar_free_x((opvar *)tmproom._24_8_);
        tmproom.rlit = '\0';
        tmproom.filled = '\0';
        tmproom._26_6_ = 0;
      }
      if (ov_07 == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_room");
      }
      else {
        opvar_free_x(ov_07);
      }
      if (ov_06 == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_room");
      }
      else {
        opvar_free_x(ov_06);
      }
      if (ov_05 == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_room");
      }
      else {
        opvar_free_x(ov_05);
      }
      if ((coder->failed_room[coder->n_subroom + -1] == '\0') &&
         (pmVar1 = build_room(lev,(room *)&tmpcr,coder->croom), pmVar1 != (mkroom *)0x0)) {
        coder->tmproomlist[coder->n_subroom] = pmVar1;
        coder->failed_room[coder->n_subroom] = '\0';
        coder->n_subroom = coder->n_subroom + 1;
      }
      else {
        coder->tmproomlist[coder->n_subroom] = (mkroom *)0x0;
        coder->failed_room[coder->n_subroom] = '\x01';
        coder->n_subroom = coder->n_subroom + 1;
      }
    }
    return;
  }
  panic("Too deeply nested rooms?!");
}

Assistant:

static void spo_room(struct sp_coder *coder, struct level *lev)
{
	if (coder->n_subroom > MAX_NESTED_ROOMS) {
	    panic("Too deeply nested rooms?!");
	} else {
	    struct opvar *filled, *h, *w, *yalign, *xalign,
			 *y, *x, *rlit, *chance, *rtype;

	    room tmproom;
	    struct mkroom *tmpcr;

	    if (!OV_pop_i(h) ||
		!OV_pop_i(w) ||
		!OV_pop_i(y) ||
		!OV_pop_i(x) ||
		!OV_pop_i(yalign) ||
		!OV_pop_i(xalign) ||
		!OV_pop_i(filled) ||
		!OV_pop_i(rlit) ||
		!OV_pop_i(chance) ||
		!OV_pop_i(rtype)) return;

	    tmproom.x = OV_i(x);
	    tmproom.y = OV_i(y);
	    tmproom.w = OV_i(w);
	    tmproom.h = OV_i(h);
	    tmproom.xalign = OV_i(xalign);
	    tmproom.yalign = OV_i(yalign);
	    tmproom.rtype = OV_i(rtype);
	    tmproom.chance = OV_i(chance);
	    tmproom.rlit = OV_i(rlit);
	    tmproom.filled = OV_i(filled);

	    opvar_free(x);
	    opvar_free(y);
	    opvar_free(w);
	    opvar_free(h);
	    opvar_free(xalign);
	    opvar_free(yalign);
	    opvar_free(rtype);
	    opvar_free(chance);
	    opvar_free(rlit);
	    opvar_free(filled);

	    if (!coder->failed_room[coder->n_subroom - 1]) {
		tmpcr = build_room(lev, &tmproom, coder->croom);
		if (tmpcr) {
		    coder->tmproomlist[coder->n_subroom] = tmpcr;
		    coder->failed_room[coder->n_subroom] = FALSE;
		    coder->n_subroom++;
		    return;
		}
	    } /* failed to create parent room, so fail this too */
	}
	coder->tmproomlist[coder->n_subroom] = NULL;
	coder->failed_room[coder->n_subroom] = TRUE;
	coder->n_subroom++;
}